

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

bool __thiscall bssl::Vector<int>::MaybeGrow(Vector<int> *this)

{
  size_t sVar1;
  int *__dest;
  int line;
  ulong uVar2;
  
  uVar2 = this->capacity_;
  if (this->size_ < uVar2) {
    return true;
  }
  if (uVar2 == 0) {
    uVar2 = 0x10;
  }
  else {
    if ((long)uVar2 < 0) {
      line = 0x14d;
      goto LAB_003306ec;
    }
    uVar2 = uVar2 * 2;
  }
  if (uVar2 >> 0x3e == 0) {
    __dest = (int *)OPENSSL_malloc(uVar2 * 4);
    if (__dest == (int *)0x0) {
      return __dest != (int *)0x0;
    }
    sVar1 = this->size_;
    if (sVar1 != 0) {
      memmove(__dest,this->data_,sVar1 * 4);
    }
    OPENSSL_free(this->data_);
    this->data_ = (int *)0x0;
    this->size_ = 0;
    this->data_ = __dest;
    this->size_ = sVar1;
    this->capacity_ = uVar2;
    return true;
  }
  line = 0x153;
LAB_003306ec:
  ERR_put_error(0xe,0,0x45,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                ,line);
  return false;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }